

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O0

int Imf_3_2::
    SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
              (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               *begin,__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                      *end,bool multipart,string *heroView)

{
  bool bVar1;
  __type _Var2;
  pointer pMVar3;
  pointer pMVar4;
  mapped_type *pmVar5;
  byte in_DL;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  i_2;
  const_iterator view;
  bool layer_has_hero;
  const_iterator layer;
  int partCount;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  layerToPart;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  i_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  viewsInLayers;
  string lname;
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  i;
  undefined4 in_stack_fffffffffffffc38;
  mapped_type in_stack_fffffffffffffc3c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  MultiViewChannelName *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  const_iterator in_stack_fffffffffffffc80;
  string local_330 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0 [2];
  _Self local_278;
  _Self local_270 [9];
  _Self local_228;
  _Self local_220;
  undefined1 local_211;
  iterator local_210;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_208;
  iterator local_200;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1f8;
  int local_1ec;
  MultiViewChannelName *local_1b8;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  string local_1a0 [32];
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  local_180 [7];
  MultiViewChannelName *local_148;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
  local_30 [2];
  byte local_19;
  undefined8 *local_10;
  int local_4;
  
  local_19 = in_DL & 1;
  if (local_19 == 0) {
    local_30[0]._M_current = (MultiViewChannelName *)*in_RDI;
    local_19 = 0;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                               *)in_stack_fffffffffffffc40,
                              (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)),
          bVar1) {
      pMVar3 = __gnu_cxx::
               __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               ::operator->(local_30);
      pMVar3->part_number = 0;
      __gnu_cxx::
      __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
      ::operator->(local_30);
      bVar1 = std::operator==(&in_stack_fffffffffffffc40->first,
                              (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38))
      ;
      if (bVar1) {
        pMVar3 = __gnu_cxx::
                 __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                 ::operator->(local_30);
        pMVar4 = __gnu_cxx::
                 __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                 ::operator->(local_30);
        std::__cxx11::string::operator=((string *)&pMVar4->internal_name,(string *)pMVar3);
      }
      else {
        __gnu_cxx::
        __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
        ::operator->(local_30);
        MultiViewChannelName::getLayer_abi_cxx11_
                  ((MultiViewChannelName *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        bVar1 = std::operator==(&in_stack_fffffffffffffc40->first,
                                (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38
                                                ));
        if (bVar1) {
          __gnu_cxx::
          __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
          ::operator->(local_30);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                                  &in_stack_fffffffffffffc58->name);
          if (_Var2) {
            pMVar3 = __gnu_cxx::
                     __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                     ::operator->(local_30);
            pMVar4 = __gnu_cxx::
                     __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                     ::operator->(local_30);
            std::__cxx11::string::operator=((string *)&pMVar4->internal_name,(string *)pMVar3);
          }
          else {
            __gnu_cxx::
            __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
            ::operator->(local_30);
            std::operator+(in_stack_fffffffffffffc68,
                           (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            __gnu_cxx::
            __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
            ::operator->(local_30);
            std::operator+(in_stack_fffffffffffffc48,&in_stack_fffffffffffffc40->first);
            pMVar3 = __gnu_cxx::
                     __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                     ::operator->(local_30);
            std::__cxx11::string::operator=((string *)&pMVar3->internal_name,local_80);
            std::__cxx11::string::~string(local_80);
            std::__cxx11::string::~string(local_a0);
          }
        }
        else {
          std::operator+(in_stack_fffffffffffffc68,
                         (char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          __gnu_cxx::
          __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
          ::operator->(local_30);
          std::operator+(in_stack_fffffffffffffc48,&in_stack_fffffffffffffc40->first);
          std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
          __gnu_cxx::
          __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
          ::operator->(local_30);
          MultiViewChannelName::getSuffix_abi_cxx11_(in_stack_fffffffffffffc58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         in_stack_fffffffffffffc70);
          pMVar3 = __gnu_cxx::
                   __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                   ::operator->(local_30);
          std::__cxx11::string::operator=((string *)&pMVar3->internal_name,local_c0);
          std::__cxx11::string::~string(local_c0);
          std::__cxx11::string::~string(local_140);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string(local_100);
          std::__cxx11::string::~string(local_120);
        }
        std::__cxx11::string::~string(local_50);
      }
      local_148 = (MultiViewChannelName *)
                  __gnu_cxx::
                  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                  ::operator++((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                                *)in_stack_fffffffffffffc48,
                               (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
    }
    local_4 = 1;
  }
  else {
    local_10 = in_RDI;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)0x207370);
    local_180[0]._M_current = (MultiViewChannelName *)*local_10;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                               *)in_stack_fffffffffffffc40,
                              (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
      ::operator->(local_180);
      MultiViewChannelName::getLayer_abi_cxx11_
                ((MultiViewChannelName *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffc80._M_node,
                   (key_type *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      __gnu_cxx::
      __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
      ::operator->(local_180);
      pVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       &in_stack_fffffffffffffc58->name);
      local_1b0 = (_Base_ptr)pVar6.first._M_node;
      local_1a8 = pVar6.second;
      std::__cxx11::string::~string(local_1a0);
      local_1b8 = (MultiViewChannelName *)
                  __gnu_cxx::
                  __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                  ::operator++((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                                *)in_stack_fffffffffffffc48,
                               (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
    }
    std::
    map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
    ::map((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
           *)0x207492);
    local_1ec = 0;
    local_200._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::_Rb_tree_const_iterator(&local_1f8,&local_200);
    while( true ) {
      local_210._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_Rb_tree_const_iterator(&local_208,&local_210);
      bVar1 = std::operator!=(&local_1f8,&local_208);
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x20751c);
      in_stack_fffffffffffffc80 =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                  (key_type *)0x207530);
      local_220._M_node = in_stack_fffffffffffffc80._M_node;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x207551);
      local_228._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      local_211 = std::operator!=(&local_220,&local_228);
      if ((bool)local_211) {
        in_stack_fffffffffffffc7c = local_1ec;
        local_1ec = local_1ec + 1;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x2075b2);
        std::make_pair<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  (in_stack_fffffffffffffc48,&in_stack_fffffffffffffc40->first);
        pmVar5 = std::
                 map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                 ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                               *)in_stack_fffffffffffffc80._M_node,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        *pmVar5 = in_stack_fffffffffffffc7c;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(in_stack_fffffffffffffc40);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x20764e);
      local_270[0]._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      while( true ) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x20766f);
        local_278._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        bVar1 = std::operator!=(local_270,&local_278);
        if (!bVar1) break;
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x2076ae);
        bVar1 = std::operator!=(&in_stack_fffffffffffffc40->first,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        if (bVar1) {
          iVar7 = local_1ec;
          local_1ec = local_1ec + 1;
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x2076e8);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2076fa);
          std::make_pair<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    (in_stack_fffffffffffffc48,&in_stack_fffffffffffffc40->first);
          pmVar5 = std::
                   map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                                 *)in_stack_fffffffffffffc80._M_node,
                                (key_type *)
                                CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          *pmVar5 = iVar7;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffffc40);
        }
        local_2d0[0].field_2._0_8_ =
             std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffffc48,
                          (int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
      }
      local_2d0[0]._M_string_length =
           (size_type)
           std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20)
                       );
    }
    local_2d0[0]._0_8_ = *local_10;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                               *)in_stack_fffffffffffffc40,
                              (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)),
          bVar1) {
      __x = local_2d0;
      pMVar3 = __gnu_cxx::
               __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               ::operator->((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                             *)__x);
      pMVar4 = __gnu_cxx::
               __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               ::operator->((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                             *)__x);
      std::__cxx11::string::operator=((string *)&pMVar4->internal_name,(string *)pMVar3);
      __gnu_cxx::
      __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
      ::operator->((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                    *)local_2d0);
      MultiViewChannelName::getLayer_abi_cxx11_
                ((MultiViewChannelName *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      __gnu_cxx::
      __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
      ::operator->((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                    *)local_2d0);
      std::make_pair<std::__cxx11::string,std::__cxx11::string&>
                (__x,&in_stack_fffffffffffffc40->first);
      in_stack_fffffffffffffc40 =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
              ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                            *)in_stack_fffffffffffffc80._M_node,
                           (key_type *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                          );
      in_stack_fffffffffffffc3c = *(mapped_type *)&in_stack_fffffffffffffc40->first;
      pMVar3 = __gnu_cxx::
               __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
               ::operator->((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                             *)local_2d0);
      pMVar3->part_number = in_stack_fffffffffffffc3c;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(in_stack_fffffffffffffc40);
      std::__cxx11::string::~string(local_330);
      __gnu_cxx::
      __normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
      ::operator++((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                    *)__x,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
    }
    local_4 = local_1ec;
    std::
    map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
    ::~map((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
            *)0x20792a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x207937);
  }
  return local_4;
}

Assistant:

inline int
SplitChannels (
    const T&           begin,
    const T&           end,
    bool               multipart = true,
    const std::string& heroView  = std::string ())
{
    if (!multipart)
    {
        for (T i = begin; i != end; i++)
        {
            i->part_number = 0;

            //does this have a view name set?
            if (i->view == "") { i->internal_name = i->name; }
            else
            {

                std::string lname = i->getLayer ();

                // no layer, only non-hero views get view name in layer name

                if (lname == "")
                {
                    if (i->view == heroView) { i->internal_name = i->name; }
                    else
                    {
                        i->internal_name = i->view + "." + i->name;
                    }
                }
                else
                {
                    i->internal_name =
                        lname + "." + i->view + "." + i->getSuffix ();
                }
            }
        }
        // single part created
        return 1;
    }
    else
    {
        // step 1: extract individual layers and parts
        // for each layer, enumerate which views are active

        std::map<std::string, std::set<std::string>> viewsInLayers;
        for (T i = begin; i != end; i++)
        {
            viewsInLayers[i->getLayer ()].insert (i->view);
        }

        // step 2: assign a part number to each layer/view

        std::map<std::pair<std::string, std::string>, int> layerToPart;

        int partCount = 0;

        for (std::map<std::string, std::set<std::string>>::const_iterator
                 layer = viewsInLayers.begin ();
             layer != viewsInLayers.end ();
             layer++)
        {
            // if this layer has a heroView, insert that first
            bool layer_has_hero =
                layer->second.find (heroView) != layer->second.end ();
            if (layer_has_hero)
            {
                layerToPart[std::make_pair (layer->first, heroView)] =
                    partCount++;
            }

            // insert other layers which aren't the hero view
            for (std::set<std::string>::const_iterator view =
                     layer->second.begin ();
                 view != layer->second.end ();
                 view++)
            {
                if (*view != heroView)
                {
                    layerToPart[std::make_pair (layer->first, *view)] =
                        partCount++;
                }
            }
        }

        // step 3: update part number of each provided channel

        for (T i = begin; i != end; i++)
        {
            i->internal_name = i->name;
            i->part_number =
                layerToPart[std::make_pair (i->getLayer (), i->view)];
        }

        // return number of parts created
        return partCount;
    }
}